

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::CheckOpcode1(TypeChecker *this,Opcode opcode,Limits *limits)

{
  Type TVar1;
  char *desc;
  Limits *limits_local;
  TypeChecker *this_local;
  Opcode opcode_local;
  Result result;
  
  this_local._0_4_ = opcode.enum_;
  TVar1 = Opcode::GetParamType1((Opcode *)&this_local);
  TVar1 = GetMemoryParam(TVar1,limits);
  desc = Opcode::GetName((Opcode *)&this_local);
  this_local._4_4_ = PopAndCheck1Type(this,TVar1,desc);
  TVar1 = Opcode::GetResultType((Opcode *)&this_local);
  PushType(this,TVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckOpcode1(Opcode opcode, const Limits* limits) {
  Result result = PopAndCheck1Type(
      GetMemoryParam(opcode.GetParamType1(), limits), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}